

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extent.c
# Opt level: O1

extent_t *
extents_alloc(tsdn_t *tsdn,arena_t *arena,extent_hooks_t **r_extent_hooks,extents_t *extents,
             void *new_addr,size_t size,size_t pad,size_t alignment,_Bool slab,szind_t szind,
             _Bool *zero,_Bool *commit)

{
  byte *pbVar1;
  nstime_t *pnVar2;
  ulong *puVar3;
  extent_t *size_00;
  pthread_mutex_t *__mutex;
  uint64_t *puVar4;
  witness_t **ppwVar5;
  uint64_t uVar6;
  _Bool _Var7;
  int iVar8;
  uint uVar9;
  extent_split_interior_result_t eVar10;
  extent_hooks_t *peVar11;
  extents_t *peVar12;
  ulong uVar13;
  long lVar14;
  size_t sVar15;
  extents_t *peVar16;
  byte bVar17;
  byte bVar18;
  rtree_ctx_t *extent;
  _Bool gdump;
  undefined1 extraout_DL;
  undefined1 gdump_00;
  extent_t *extraout_RDX;
  ulong uVar19;
  extent_t *extraout_RDX_00;
  extent_t *extent_00;
  extent_t *extraout_RDX_01;
  ulong uVar20;
  rtree_ctx_t *ctx;
  extent_t *size_01;
  long lVar21;
  ulong uVar22;
  extent_t *peVar23;
  ulong uVar24;
  bitmap_t bVar25;
  undefined1 growing_retained;
  extents_t **lead;
  uint uVar26;
  void *pvVar27;
  bool bVar28;
  undefined1 growing_retained_00;
  szind_t in_stack_fffffffffffffdd8;
  arena_t *paVar29;
  extent_t *peStack_1d8;
  extent_t *peStack_1d0;
  extents_t *peStack_1c8;
  extents_t *peStack_1c0;
  extents_t *peStack_1b8;
  rtree_ctx_t rStack_1b0;
  
  if (tsdn == (tsdn_t *)0x0) {
    ctx = &rStack_1b0;
    rtree_ctx_data_init(ctx);
  }
  else {
    ctx = &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  __mutex = (pthread_mutex_t *)((long)&(extents->mtx).field_0 + 0x40);
  iVar8 = pthread_mutex_trylock(__mutex);
  if (iVar8 != 0) {
    malloc_mutex_lock_slow(&extents->mtx);
    (extents->mtx).field_0.field_0.locked.repr = true;
  }
  puVar4 = &(extents->mtx).field_0.field_0.prof_data.n_lock_ops;
  *puVar4 = *puVar4 + 1;
  if ((extents->mtx).field_0.field_0.prof_data.prev_owner != tsdn) {
    (extents->mtx).field_0.field_0.prof_data.prev_owner = tsdn;
    ppwVar5 = &(extents->mtx).field_0.witness.link.qre_prev;
    *ppwVar5 = (witness_t *)((long)&(*ppwVar5)->name + 1);
  }
  if (*r_extent_hooks == (extent_hooks_t *)0x0) {
    peVar11 = base_extent_hooks_get(arena->base);
    *r_extent_hooks = peVar11;
  }
  size_00 = (extent_t *)(pad + size);
  if (new_addr != (void *)0x0) {
    peVar12 = (extents_t *)extent_lock_from_addr(tsdn,ctx,new_addr,false);
    extent_00 = extraout_RDX;
    peVar16 = (extents_t *)0x0;
    if (peVar12 != (extents_t *)0x0) {
      if ((((arena_t *)arenas[(peVar12->mtx).field_0.lock_order & 0xfff].repr != arena) ||
          ((extent_t *)
           (((anon_union_8_2_694bb3b2_for_extent_s_2 *)&(peVar12->mtx).field_0.witness.comp)->
            e_size_esn & 0xfffffffffffff000) < size_00)) ||
         (peVar16 = peVar12,
         (*(ushort *)((long)&(peVar12->mtx).field_0 + 2) & extent_state_retained) != extents->state)
         ) {
        peVar16 = (extents_t *)0x0;
      }
      uVar19 = ((long)peVar12 * -0x775ed61580000000 |
               (ulong)((long)peVar12 * -0x783c846eeebdac2b) >> 0x21) * 0x4cf5ad432745937f ^
               0xd50dcc13;
      uVar13 = uVar19 + 0xd50dcc13;
      uVar19 = uVar19 + 0x1aa1b9826;
      uVar13 = (uVar13 >> 0x21 ^ uVar13) * -0xae502812aa7333;
      lVar21 = (uVar13 >> 0x21 ^ uVar13) * -0x3b314601e57a13ad;
      uVar13 = (uVar19 >> 0x21 ^ uVar19) * -0xae502812aa7333;
      lVar14 = (uVar13 >> 0x21 ^ uVar13) * -0x3b314601e57a13ad;
      uVar9 = ((uint)((ulong)lVar14 >> 0x21) ^ (uint)lVar14) +
              ((uint)((ulong)lVar21 >> 0x21) ^ (uint)lVar21) & 0xff;
      extent_mutex_pool.mutexes[uVar9].field_0.field_0.locked.repr = false;
      pthread_mutex_unlock
                ((pthread_mutex_t *)((long)&extent_mutex_pool.mutexes[uVar9].field_0 + 0x40));
      extent_00 = extraout_RDX_00;
    }
    goto LAB_0012d607;
  }
  uVar13 = alignment + 0xfff & 0xfffffffffffff000;
  size_01 = (extent_t *)((long)&size_00[-0x20].e_bits + uVar13);
  extent_00 = (extent_t *)size;
  if (size_00 <= size_01) {
    sVar15 = extent_size_quantize_ceil((size_t)size_01);
    if (sVar15 < 0x7000000000000001) {
      uVar19 = sVar15 * 2 - 1;
      lVar14 = 0x3f;
      if (uVar19 != 0) {
        for (; uVar19 >> lVar14 == 0; lVar14 = lVar14 + -1) {
        }
      }
      uVar9 = (uint)lVar14;
      iVar8 = uVar9 - 0xe;
      if (uVar9 < 0xe) {
        iVar8 = 0;
      }
      bVar18 = 0xc;
      if (0xe < uVar9) {
        bVar18 = (char)lVar14 - 3;
      }
      uVar9 = ((uint)(((sVar15 - 1 >> (bVar18 & 0x3f)) << (bVar18 & 0x3f)) >> (bVar18 & 0x3f)) & 3)
              + iVar8 * 4;
    }
    else {
      uVar9 = 199;
    }
    extent_00 = (extent_t *)
                ((extents->bitmap[uVar9 >> 6] >> ((byte)uVar9 & 0x3f)) << ((byte)uVar9 & 0x3f));
    uVar22 = (ulong)(uVar9 & 0xffffffc0);
    uVar19 = (ulong)(uVar9 >> 6) - 1;
LAB_0012d99c:
    if (extent_00 == (extent_t *)0x0) goto code_r0x0012d9a1;
    lVar14 = 0;
    if (extent_00 != (extent_t *)0x0) {
      for (; ((ulong)extent_00 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
      }
    }
    uVar22 = lVar14 + uVar22;
    goto LAB_0012d9e5;
  }
  goto LAB_0012d605;
code_r0x0012d9a1:
  extent_00 = (extent_t *)extents->bitmap[uVar19 + 2];
  uVar22 = uVar22 + 0x40;
  uVar19 = uVar19 + 1;
  if (2 < uVar19) goto code_r0x0012d9b6;
  goto LAB_0012d99c;
code_r0x0012d9b6:
  uVar22 = 200;
LAB_0012d9e5:
  uVar19 = uVar22 & 0xffffffff;
  if (uVar19 < 200) {
    peVar16 = (extents_t *)0x0;
LAB_0012da01:
    peVar12 = (extents_t *)extent_heap_first(extents->heaps + uVar19);
    extent_00 = extraout_RDX_01;
    if ((extents->delay_coalesce != true) ||
       (extent_00 = (extent_t *)
                    (sz_pind2sz_tab[uVar22 & 0xffffffff] >>
                    ((byte)opt_lg_extent_max_active_fit & 0x3f)), extent_00 <= size_01)) {
      if (peVar16 != (extents_t *)0x0) {
        extent_00 = (extent_t *)((ulong)(peVar12->mtx).field_0.witness.name >> 0x2a);
        peVar23 = (extent_t *)((ulong)(peVar16->mtx).field_0.witness.name >> 0x2a);
        iVar8 = (uint)(peVar23 < extent_00) - (uint)(extent_00 < peVar23);
        if (iVar8 == 0) {
          extent_00 = (extent_t *)(peVar12->mtx).field_0.field_0.prof_data.max_wait_time.ns;
          peVar23 = (extent_t *)(peVar16->mtx).field_0.field_0.prof_data.max_wait_time.ns;
          iVar8 = (uint)(extent_00 >= peVar23 && extent_00 != peVar23) - (uint)(extent_00 < peVar23)
          ;
        }
        if (-1 < iVar8) goto LAB_0012da70;
      }
      peVar16 = peVar12;
    }
LAB_0012da70:
    if (uVar19 != 199) {
      uVar19 = uVar19 + 1;
      extent_00 = (extent_t *)
                  ((extents->bitmap[uVar19 >> 6] >> ((byte)uVar19 & 0x3f)) << ((byte)uVar19 & 0x3f))
      ;
      uVar22 = uVar19 & 0xffffffffffffffc0;
      uVar19 = (uVar19 >> 6) - 1;
LAB_0012da9b:
      if (extent_00 == (extent_t *)0x0) goto code_r0x0012daa0;
      lVar14 = 0;
      if (extent_00 != (extent_t *)0x0) {
        for (; ((ulong)extent_00 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
        }
      }
      uVar22 = lVar14 + uVar22;
      goto LAB_0012dac4;
    }
    goto LAB_0012dad8;
  }
  peVar16 = (extents_t *)0x0;
LAB_0012dad8:
  if ((0x1000 < alignment) && (peVar16 == (extents_t *)0x0)) {
    sVar15 = extent_size_quantize_ceil((size_t)size_00);
    if (sVar15 < 0x7000000000000001) {
      uVar19 = sVar15 * 2 - 1;
      lVar14 = 0x3f;
      if (uVar19 != 0) {
        for (; uVar19 >> lVar14 == 0; lVar14 = lVar14 + -1) {
        }
      }
      uVar9 = (uint)lVar14;
      iVar8 = uVar9 - 0xe;
      if (uVar9 < 0xe) {
        iVar8 = 0;
      }
      bVar18 = 0xc;
      if (0xe < uVar9) {
        bVar18 = (char)lVar14 - 3;
      }
      uVar9 = ((uint)(((sVar15 - 1 >> (bVar18 & 0x3f)) << (bVar18 & 0x3f)) >> (bVar18 & 0x3f)) & 3)
              + iVar8 * 4;
    }
    else {
      uVar9 = 199;
    }
    sVar15 = extent_size_quantize_ceil((size_t)size_01);
    if (sVar15 < 0x7000000000000001) {
      uVar19 = sVar15 * 2 - 1;
      lVar14 = 0x3f;
      if (uVar19 != 0) {
        for (; uVar19 >> lVar14 == 0; lVar14 = lVar14 + -1) {
        }
      }
      uVar26 = (uint)lVar14;
      iVar8 = uVar26 - 0xe;
      if (uVar26 < 0xe) {
        iVar8 = 0;
      }
      bVar18 = 0xc;
      if (0xe < uVar26) {
        bVar18 = (char)lVar14 - 3;
      }
      uVar26 = ((uint)(((sVar15 - 1 >> (bVar18 & 0x3f)) << (bVar18 & 0x3f)) >> (bVar18 & 0x3f)) & 3)
               + iVar8 * 4;
    }
    else {
      uVar26 = 199;
    }
    extent_00 = (extent_t *)
                ((extents->bitmap[uVar9 >> 6] >> ((byte)uVar9 & 0x3f)) << ((byte)uVar9 & 0x3f));
    uVar22 = (ulong)(uVar9 & 0xffffffc0);
    uVar19 = (ulong)(uVar9 >> 6) - 1;
LAB_0012dbb0:
    if (extent_00 == (extent_t *)0x0) goto code_r0x0012dbb5;
    lVar14 = 0;
    if (extent_00 != (extent_t *)0x0) {
      for (; ((ulong)extent_00 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
      }
    }
    uVar22 = lVar14 + uVar22;
    goto LAB_0012dbd8;
  }
  goto LAB_0012d607;
code_r0x0012daa0:
  extent_00 = (extent_t *)extents->bitmap[uVar19 + 2];
  uVar22 = uVar22 + 0x40;
  uVar19 = uVar19 + 1;
  if (2 < uVar19) goto code_r0x0012dab5;
  goto LAB_0012da9b;
code_r0x0012dab5:
  uVar22 = 200;
LAB_0012dac4:
  uVar19 = uVar22 & 0xffffffff;
  if (199 < uVar19) goto LAB_0012dad8;
  goto LAB_0012da01;
code_r0x0012dbb5:
  extent_00 = (extent_t *)extents->bitmap[uVar19 + 2];
  uVar22 = uVar22 + 0x40;
  uVar19 = uVar19 + 1;
  if (2 < uVar19) goto code_r0x0012dbca;
  goto LAB_0012dbb0;
code_r0x0012dc93:
  bVar25 = extents->bitmap[(long)((long)&extent_00->e_bits + 2)];
  uVar22 = uVar22 + 0x40;
  extent_00 = (extent_t *)((long)&extent_00->e_bits + 1);
  if ((extent_t *)0x2 < extent_00) goto code_r0x0012dca8;
  goto LAB_0012dc8e;
code_r0x0012dca8:
  uVar22 = 200;
LAB_0012dcb6:
  peVar12 = peVar16;
  peVar16 = (extents_t *)0x0;
  if (uVar26 <= (uint)uVar22) goto LAB_0012d607;
  goto LAB_0012dc02;
code_r0x0012dbca:
  uVar22 = 200;
LAB_0012dbd8:
  if ((uint)uVar22 < uVar26) {
    peVar12 = (extents_t *)-uVar13;
LAB_0012dc02:
    peVar16 = (extents_t *)extent_heap_first(extents->heaps + (uVar22 & 0xffffffff));
    uVar19 = (ulong)(peVar16->mtx).field_0.field_0.prof_data.max_wait_time.ns & 0xfffffffffffff000;
    uVar24 = (uVar13 - 1) + uVar19 & -uVar13;
    uVar20 = (((anon_union_8_2_694bb3b2_for_extent_s_2 *)&(peVar16->mtx).field_0.witness.comp)->
              e_size_esn & 0xfffffffffffff000) + uVar19;
    extent_00 = (extent_t *)(uVar20 - uVar24);
    if (extent_00 < size_00) {
      peVar16 = peVar12;
    }
    if (uVar24 < uVar19 || (uVar20 < uVar24 || extent_00 == (extent_t *)0x0)) {
      peVar16 = peVar12;
    }
    if ((uVar24 < uVar19 || (uVar20 < uVar24 || extent_00 == (extent_t *)0x0)) ||
        extent_00 < size_00) {
      uVar19 = (uVar22 & 0xffffffff) + 1;
      bVar25 = (extents->bitmap[uVar19 >> 6] >> ((byte)uVar19 & 0x3f)) << ((byte)uVar19 & 0x3f);
      uVar22 = uVar19 & 0xffffffffffffffc0;
      extent_00 = (extent_t *)((uVar19 >> 6) - 1);
LAB_0012dc8e:
      if (bVar25 == 0) goto code_r0x0012dc93;
      lVar14 = 0;
      if (bVar25 != 0) {
        for (; (bVar25 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
        }
      }
      uVar22 = lVar14 + uVar22;
      goto LAB_0012dcb6;
    }
    goto LAB_0012d607;
  }
LAB_0012d605:
  peVar16 = (extents_t *)0x0;
LAB_0012d607:
  if (peVar16 == (extents_t *)0x0) {
    peVar16 = (extents_t *)0x0;
  }
  else {
    extents_remove_locked((tsdn_t *)extents,peVar16,extent_00);
    pbVar1 = (byte *)((long)&(peVar16->mtx).field_0.lock_order + 2);
    *pbVar1 = *pbVar1 & 0xfc;
  }
  (extents->mtx).field_0.field_0.locked.repr = false;
  pthread_mutex_unlock(__mutex);
  if (peVar16 != (extents_t *)0x0) {
    lead = &peStack_1c0;
    extent = ctx;
    peStack_1b8 = peVar16;
    eVar10 = extent_split_interior
                       (tsdn,arena,r_extent_hooks,ctx,(extent_t **)&peStack_1b8,(extent_t **)lead,
                        (extent_t **)&peStack_1c8,&peStack_1d0,&peStack_1d8,(void *)size,pad,
                        alignment,(ulong)slab,SUB41(szind,0),in_stack_fffffffffffffdd8,
                        SUB81(arena,0));
    growing_retained_00 = (undefined1)in_stack_fffffffffffffdd8;
    growing_retained = SUB81(lead,0);
    if (eVar10 == extent_split_interior_ok) {
      if (peStack_1c0 != (extents_t *)0x0) {
        extent_deactivate(tsdn,(arena_t *)extents,peStack_1c0,(extent_t *)extent);
      }
      peVar16 = peStack_1b8;
      if (peStack_1c8 != (extents_t *)0x0) {
        extent_deactivate(tsdn,(arena_t *)extents,peStack_1c8,(extent_t *)extent);
        peVar16 = peStack_1b8;
      }
    }
    else {
      gdump_00 = gdump;
      if (peStack_1d8 != (extent_t *)0x0) {
        extent_deregister_impl(tsdn,peStack_1d8,gdump);
        gdump_00 = extraout_DL;
      }
      if (peStack_1d0 != (extent_t *)0x0) {
        extent_deregister_impl(tsdn,peStack_1d0,(_Bool)gdump_00);
        extents_leak(tsdn,arena,r_extent_hooks,extents,peStack_1d0,(_Bool)growing_retained);
      }
      peVar16 = (extents_t *)0x0;
    }
    if (peVar16 != (extents_t *)0x0) {
      paVar29 = arena;
      if ((*commit == true) &&
         ((undefined1  [112])((undefined1  [112])(peVar16->mtx).field_0 & (undefined1  [112])0x2000)
          == (undefined1  [112])0x0)) {
        uVar13 = (ulong)(peVar16->mtx).field_0.witness.comp & 0xfffffffffffff000;
        _Var7 = extent_commit_impl(tsdn,arena,r_extent_hooks,(extent_t *)peVar16,0,uVar13,
                                   (_Bool)growing_retained_00);
        if (_Var7) {
          extent_record(tsdn,arena,r_extent_hooks,extents,(extent_t *)peVar16,SUB81(uVar13,0));
          return (extent_t *)0x0;
        }
        peVar11 = base_extent_hooks_get(arena->base);
        if ((peVar11 == &extent_hooks_default) && (opt_thp != thp_mode_always)) {
          pbVar1 = (byte *)((long)&(peVar16->mtx).field_0.lock_order + 1);
          *pbVar1 = *pbVar1 | 0x80;
        }
      }
      uVar6 = (peVar16->mtx).field_0.field_0.prof_data.tot_wait_time.ns;
      uVar9 = (uint)uVar6;
      if ((uVar9 >> 0xd & 1) != 0) {
        *commit = true;
      }
      if ((short)uVar6 < 0) {
        *zero = true;
      }
      if (alignment < 0x1000 && pad != 0) {
        uVar26 = (int)alignment + 0x3fU & 0x1fc0;
        lVar14 = 0x3f;
        if (uVar26 != 0) {
          for (; uVar26 >> lVar14 == 0; lVar14 = lVar14 + -1) {
          }
        }
        bVar18 = (byte)lVar14;
        if (tsdn == (tsdn_t *)0x0) {
          pvVar27 = arenas[uVar9 & 0xfff].repr;
          uVar13 = *(ulong *)((long)pvVar27 + 0x2850);
          do {
            uVar22 = uVar13 * 0x5851f42d4c957f2d + 0x14057b7ef767814f;
            puVar3 = (ulong *)((long)pvVar27 + 0x2850);
            LOCK();
            uVar19 = *puVar3;
            bVar28 = uVar13 == uVar19;
            if (bVar28) {
              *puVar3 = uVar22;
              uVar19 = uVar13;
            }
            UNLOCK();
            uVar13 = uVar19;
          } while (bVar28);
          bVar17 = -('\f' - bVar18);
        }
        else {
          uVar22 = (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_offset_state *
                   0x5851f42d4c957f2d + 0x14057b7ef767814f;
          (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_offset_state = uVar22;
          bVar17 = bVar18 + 0x34;
        }
        pnVar2 = &(peVar16->mtx).field_0.field_0.prof_data.max_wait_time;
        pnVar2->ns = pnVar2->ns + ((uVar22 >> (bVar17 & 0x3f)) << (bVar18 & 0x3f));
      }
      if (slab) {
        pbVar1 = (byte *)((long)&(peVar16->mtx).field_0.lock_order + 1);
        *pbVar1 = *pbVar1 | 0x10;
        extent_interior_register(tsdn,ctx,(extent_t *)peVar16,szind);
      }
      if (*zero != true) {
        return (extent_t *)peVar16;
      }
      if ((undefined1  [112])((undefined1  [112])(peVar16->mtx).field_0 & (undefined1  [112])0x8000)
          != (undefined1  [112])0x0) {
        return (extent_t *)peVar16;
      }
      pvVar27 = (void *)((peVar16->mtx).field_0.field_0.prof_data.max_wait_time.ns &
                        0xfffffffffffff000);
      uVar13 = (ulong)(peVar16->mtx).field_0.witness.comp & 0xfffffffffffff000;
      peVar11 = base_extent_hooks_get(paVar29->base);
      if (((peVar11 == &extent_hooks_default) && (opt_thp != thp_mode_always)) &&
         (_Var7 = pages_purge_forced(pvVar27,uVar13), !_Var7)) {
        return (extent_t *)peVar16;
      }
      memset(pvVar27,0,uVar13);
      return (extent_t *)peVar16;
    }
  }
  return (extent_t *)0x0;
}

Assistant:

extent_t *
extents_alloc(tsdn_t *tsdn, arena_t *arena, extent_hooks_t **r_extent_hooks,
    extents_t *extents, void *new_addr, size_t size, size_t pad,
    size_t alignment, bool slab, szind_t szind, bool *zero, bool *commit) {
	assert(size + pad != 0);
	assert(alignment != 0);
	witness_assert_depth_to_rank(tsdn_witness_tsdp_get(tsdn),
	    WITNESS_RANK_CORE, 0);

	extent_t *extent = extent_recycle(tsdn, arena, r_extent_hooks, extents,
	    new_addr, size, pad, alignment, slab, szind, zero, commit, false);
	assert(extent == NULL || extent_dumpable_get(extent));
	return extent;
}